

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O0

buffer_type * rest_rpc::rpc_service::msgpack_codec::pack_args<char_const(&)[6]>(char (*args) [6])

{
  buffer_type *in_RDI;
  buffer_type *buffer;
  buffer_type *s;
  size_t in_stack_ffffffffffffffc8;
  sbuffer *in_stack_ffffffffffffffd0;
  
  s = in_RDI;
  msgpack::v1::sbuffer::sbuffer(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::forward_as_tuple<char_const(&)[6]>((char (*) [6])in_RDI);
  msgpack::v1::pack<msgpack::v1::sbuffer,std::tuple<char_const(&)[6]>>
            (s,(tuple<const_char_(&)[6]> *)in_RDI);
  return in_RDI;
}

Assistant:

static buffer_type pack_args(Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer, std::forward_as_tuple(std::forward<Args>(args)...));
    return buffer;
  }